

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint uivector_resize(uivector *p,size_t size)

{
  uint uVar1;
  size_t size_local;
  uivector *p_local;
  
  uVar1 = uivector_reserve(p,size << 2);
  if (uVar1 != 0) {
    p->size = size;
  }
  p_local._4_4_ = (uint)(uVar1 != 0);
  return p_local._4_4_;
}

Assistant:

static unsigned uivector_resize(uivector* p, size_t size)
{
  if(!uivector_reserve(p, size * sizeof(unsigned))) return 0;
  p->size = size;
  return 1; /*success*/
}